

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImFontGlyph *pIVar12;
  ImFontGlyph *pIVar13;
  uint uVar14;
  char *__function;
  float *pfVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  
  uVar19 = (this->Glyphs).Size;
  if ((ulong)uVar19 == 0) {
    uVar21 = 1;
  }
  else {
    uVar21 = 0;
    uVar20 = 0;
    if (0 < (int)uVar19) {
      uVar20 = uVar19;
    }
    if (uVar20 <= uVar19 - 1) {
      __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
      goto LAB_00137a33;
    }
    lVar16 = 0;
    do {
      uVar20 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar16) >> 2;
      if (uVar20 < uVar21) {
        uVar20 = uVar21;
      }
      uVar21 = uVar20;
      lVar16 = lVar16 + 0x28;
    } while ((ulong)uVar19 * 0x28 != lVar16);
    if (0xfffe < (int)uVar19) {
      __assert_fail("Glyphs.Size < 0xFFFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xc46,"void ImFont::BuildLookupTable()");
    }
    uVar21 = uVar21 + 1;
  }
  pfVar4 = (this->IndexAdvanceX).Data;
  if (pfVar4 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar4);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar5 = (this->IndexLookup).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar5);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar21);
  uVar19 = (this->Glyphs).Size;
  uVar18 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    uVar20 = (this->IndexLookup).Size;
  }
  else {
    pfVar4 = (this->IndexAdvanceX).Data;
    puVar5 = (this->IndexLookup).Data;
    pfVar15 = &((this->Glyphs).Data)->AdvanceX;
    uVar17 = 0;
    do {
      uVar2 = *(uint *)(pfVar15 + -1);
      uVar14 = uVar2 >> 2;
      if ((this->IndexAdvanceX).Size <= (int)uVar14) goto LAB_00137a07;
      pfVar4[uVar14] = *pfVar15;
      uVar20 = (this->IndexLookup).Size;
      if ((int)uVar20 <= (int)uVar14) goto LAB_00137a1e;
      puVar5[uVar14] = (unsigned_short)uVar17;
      this->Used4kPagesMap[uVar2 >> 0x11] =
           this->Used4kPagesMap[uVar2 >> 0x11] | (byte)(1 << ((byte)(uVar2 >> 0xe) & 7));
      uVar17 = uVar17 + 1;
      pfVar15 = pfVar15 + 10;
    } while (uVar18 != uVar17);
  }
  if ((uVar20 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar12 = this->FallbackGlyph;
  }
  else {
    pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar12 == (ImFontGlyph *)0x0) {
LAB_0013792b:
    if ((uVar20 < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar12 = this->FallbackGlyph;
    }
    else {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar12 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
      uVar20 = (this->IndexLookup).Size;
    }
    if ((uVar20 < 10) || (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
      pIVar12 = this->FallbackGlyph;
    }
    else {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar12 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar12 = *(byte *)pIVar12 & 0xfd;
      uVar20 = (this->IndexLookup).Size;
    }
    if (((ulong)this->FallbackChar < (ulong)(long)(int)uVar20) &&
       (uVar18 = (ulong)(this->IndexLookup).Data[this->FallbackChar], uVar18 != 0xffff)) {
      pIVar13 = (this->Glyphs).Data;
      pIVar12 = pIVar13 + uVar18;
      this->FallbackGlyph = pIVar12;
      if (pIVar13 == (ImFontGlyph *)0x0) goto LAB_001379ce;
      fVar22 = pIVar12->AdvanceX;
    }
    else {
      this->FallbackGlyph = (ImFontGlyph *)0x0;
LAB_001379ce:
      fVar22 = 0.0;
    }
    this->FallbackAdvanceX = fVar22;
    pfVar4 = (this->IndexAdvanceX).Data;
    uVar18 = 0;
    while ((long)uVar18 < (long)(this->IndexAdvanceX).Size) {
      pfVar15 = pfVar4 + uVar18;
      if (*pfVar15 <= 0.0 && *pfVar15 != 0.0) {
        pfVar4[uVar18] = fVar22;
      }
      uVar18 = uVar18 + 1;
      if (uVar21 == uVar18) {
        return;
      }
    }
  }
  else {
    if ((int)uVar19 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x695,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
    }
    pIVar12 = (this->Glyphs).Data;
    if (((undefined1  [40])pIVar12[uVar18 - 1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      uVar18 = uVar18 + 1;
      iVar3 = (this->Glyphs).Capacity;
      if (iVar3 <= (int)uVar19) {
        if (iVar3 == 0) {
          uVar19 = 8;
        }
        else {
          uVar19 = iVar3 / 2 + iVar3;
        }
        uVar17 = (ulong)uVar19;
        if ((int)uVar19 <= (int)uVar18) {
          uVar17 = uVar18 & 0xffffffff;
        }
        pIVar12 = (ImFontGlyph *)ImGui::MemAlloc(uVar17 * 0x28);
        pIVar13 = (this->Glyphs).Data;
        if (pIVar13 != (ImFontGlyph *)0x0) {
          memcpy(pIVar12,pIVar13,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar12;
        (this->Glyphs).Capacity = (int)uVar17;
        uVar20 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = (int)uVar18;
    }
    if ((uVar20 < 0x21) || (uVar17 = (ulong)(this->IndexLookup).Data[0x20], uVar17 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = pIVar12 + uVar17;
    }
    fVar22 = pIVar13->V1;
    pIVar12[uVar18 - 1].U1 = pIVar13->U1;
    pIVar12[uVar18 - 1].V1 = fVar22;
    uVar8 = *(undefined4 *)&pIVar13->field_0x0;
    fVar9 = pIVar13->AdvanceX;
    fVar10 = pIVar13->X0;
    fVar11 = pIVar13->Y0;
    fVar22 = pIVar13->Y1;
    fVar6 = pIVar13->U0;
    fVar7 = pIVar13->V0;
    pIVar12[uVar18 - 1].X1 = pIVar13->X1;
    pIVar12[uVar18 - 1].Y1 = fVar22;
    pIVar12[uVar18 - 1].U0 = fVar6;
    pIVar12[uVar18 - 1].V0 = fVar7;
    *(undefined4 *)&pIVar12[uVar18 - 1].field_0x0 = uVar8;
    pIVar12[uVar18 - 1].AdvanceX = fVar9;
    pIVar12[uVar18 - 1].X0 = fVar10;
    pIVar12[uVar18 - 1].Y0 = fVar11;
    *(uint *)(pIVar12 + (uVar18 - 1)) = *(uint *)(pIVar12 + (uVar18 - 1)) & 3 | 0x24;
    fVar22 = pIVar12[uVar18 - 1].AdvanceX * 4.0;
    pIVar12[uVar18 - 1].AdvanceX = fVar22;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar22;
      uVar20 = (this->IndexLookup).Size;
      if ((int)uVar20 <= (int)(*(uint *)(pIVar12 + (uVar18 - 1)) >> 2)) {
LAB_00137a1e:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_00137a33;
      }
      (this->IndexLookup).Data[*(uint *)(pIVar12 + (uVar18 - 1)) >> 2] =
           (short)(this->Glyphs).Size - 1;
      goto LAB_0013792b;
    }
  }
LAB_00137a07:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_00137a33:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}